

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O3

void If_CluHashPrintStats(If_Man_t *p,int t)

{
  int iVar1;
  void **ppvVar2;
  uint uVar3;
  ulong uVar4;
  
  iVar1 = p->nTableSize[t];
  if (0 < iVar1) {
    uVar4 = 0;
    do {
      ppvVar2 = p->pHashTable[t] + uVar4;
      uVar3 = 0xffffffff;
      do {
        ppvVar2 = (void **)*ppvVar2;
        uVar3 = uVar3 + 1;
      } while (ppvVar2 != (void **)0x0);
      if (9 < uVar3) {
        printf("%d=%d ",uVar4 & 0xffffffff);
        iVar1 = p->nTableSize[t];
      }
      uVar4 = uVar4 + 1;
    } while ((long)uVar4 < (long)iVar1);
  }
  return;
}

Assistant:

void If_CluHashPrintStats( If_Man_t * p, int t )
{
    If_Hte_t * pEntry;
    int i, Counter;
    for ( i = 0; i < p->nTableSize[t]; i++ )
    {
        Counter = 0;
        for ( pEntry = ((If_Hte_t **)p->pHashTable[t])[i]; pEntry; pEntry = pEntry->pNext )
            Counter++;
        if ( Counter == 0 )
            continue;
        if ( Counter < 10 )
            continue;
        printf( "%d=%d ", i, Counter );
    }
}